

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asio_service_test.cxx
# Opt level: O1

int asio_service_test::global_mgr_heavy_test(void)

{
  unsigned_long __val;
  element_type *logs;
  bool bVar1;
  RaftAsioPkg **ppRVar2;
  pointer ppRVar3;
  ostream oVar4;
  int iVar5;
  long *plVar6;
  RaftAsioPkg *pRVar7;
  ostream *poVar8;
  unsigned_long uVar9;
  ulong uVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 uVar11;
  int iVar12;
  pointer ppRVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  char cVar17;
  char cVar18;
  string *psVar19;
  int __fd;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar20;
  RaftAsioPkg **entry;
  ostream *poVar21;
  RaftAsioPkg **ppRVar22;
  initializer_list<std::shared_ptr<nuraft::buffer>_> __l;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> pkgs;
  string addr;
  ptr<buffer> msg;
  RaftAsioPkg *pkg;
  nuraft_global_config g_config;
  allocator_type local_139;
  vector<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_> local_138;
  undefined1 local_120 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_110;
  _Invoker_type p_Stack_100;
  undefined2 local_f8;
  return_method_type local_c8;
  element_type *local_b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_b0;
  shared_ptr<nuraft::buffer> local_a8;
  undefined1 local_98 [32];
  ulong local_78;
  undefined1 local_70 [40];
  EventAwaiter *local_48;
  undefined8 local_40;
  undefined8 local_38;
  
  raft_functional_common::reset_log_files();
  local_38._0_4_ = 200;
  local_38._4_4_ = 0;
  local_48 = (EventAwaiter *)0x2;
  local_40._0_1_ = (__atomic_base<bool>)0x2;
  local_40._1_3_ = 0;
  local_40._4_4_ = (__atomic_base<int>)0x0;
  nuraft::nuraft_global_mgr::init((EVP_PKEY_CTX *)&local_48);
  local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
  super__Vector_impl_data._M_start = (RaftAsioPkg **)0x0;
  local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (RaftAsioPkg **)0x0;
  local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (RaftAsioPkg **)0x0;
  lVar15 = 0;
  do {
    lVar16 = lVar15 + 1;
    __val = lVar15 * 10 + 0x4e2a;
    uVar9 = __val;
    cVar18 = '\x04';
    do {
      cVar17 = cVar18;
      if (uVar9 < 100) {
        cVar17 = cVar17 + -2;
        goto LAB_0019fcbc;
      }
      if (uVar9 < 1000) {
        cVar17 = cVar17 + -1;
        goto LAB_0019fcbc;
      }
      if (uVar9 < 10000) goto LAB_0019fcbc;
      bVar1 = 99999 < uVar9;
      uVar9 = uVar9 / 10000;
      cVar18 = cVar17 + '\x04';
    } while (bVar1);
    cVar17 = cVar17 + '\x01';
LAB_0019fcbc:
    local_98._0_8_ = (RaftAsioPkg *)(local_98 + 0x10);
    std::__cxx11::string::_M_construct((ulong)local_98,cVar17);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_98._0_8_,local_98._8_4_,__val);
    plVar6 = (long *)std::__cxx11::string::replace((ulong)local_98,0,(char *)0x0,0x4be21a);
    local_120._0_8_ = &aStack_110;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 == paVar20) {
      aStack_110._M_allocated_capacity = paVar20->_M_allocated_capacity;
      aStack_110._8_8_ = plVar6[3];
    }
    else {
      aStack_110._M_allocated_capacity = paVar20->_M_allocated_capacity;
      local_120._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar6;
    }
    local_120._8_8_ = plVar6[1];
    *plVar6 = (long)paVar20;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((RaftAsioPkg *)local_98._0_8_ != (RaftAsioPkg *)(local_98 + 0x10)) {
      operator_delete((void *)local_98._0_8_);
    }
    pRVar7 = (RaftAsioPkg *)operator_new(0x120);
    pRVar7->myId = (int)lVar16;
    (pRVar7->myEndpoint)._M_dataplus._M_p = (pointer)&(pRVar7->myEndpoint).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&pRVar7->myEndpoint,local_120._0_8_,
               (pointer)(local_120._8_8_ + local_120._0_8_));
    memset(&pRVar7->sMgr,0,0xd0);
    pRVar7->alwaysInvokeCb = true;
    pRVar7->useCustomResolver = false;
    pRVar7->useLogTimestamp = false;
    (pRVar7->myLogWrapper).super___shared_ptr<logger_wrapper,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pRVar7->myLogWrapper).super___shared_ptr<logger_wrapper,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    (pRVar7->myLog).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (pRVar7->myLog).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_98._0_8_ = pRVar7;
    if (local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<RaftAsioPkg*,std::allocator<RaftAsioPkg*>>::_M_realloc_insert<RaftAsioPkg*const&>
                ((vector<RaftAsioPkg*,std::allocator<RaftAsioPkg*>> *)&local_138,
                 (iterator)
                 local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl
                 .super__Vector_impl_data._M_finish,(RaftAsioPkg **)local_98);
    }
    else {
      *local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
       super__Vector_impl_data._M_finish = pRVar7;
      local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != &aStack_110) {
      operator_delete((void *)local_120._0_8_);
    }
    lVar15 = lVar16;
  } while (lVar16 != 0x32);
  local_120._0_8_ = local_120._0_8_ & 0xffffffffffffff00;
  local_120._8_8_ = (void *)0x0;
  aStack_110._M_allocated_capacity = 0;
  aStack_110._8_8_ = (code *)0x0;
  p_Stack_100 = (_Invoker_type)0x0;
  local_f8._0_1_ = true;
  local_f8._1_1_ = false;
  iVar5 = launch_servers(&local_138,false,true,true,(init_options *)local_120);
  if ((code *)aStack_110._8_8_ != (code *)0x0) {
    (*(code *)aStack_110._8_8_)(local_120 + 8,local_120 + 8,3);
  }
  if (iVar5 == 0) {
    local_120._0_8_ = &aStack_110;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_120,"wait for Raft group ready","");
    TestSuite::sleep_sec(1,(string *)local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != &aStack_110) {
      operator_delete((void *)local_120._0_8_);
    }
    ppRVar3 = local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      ppRVar13 = local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      do {
        pRVar7 = *ppRVar13;
        nuraft::raft_server::get_current_params
                  ((raft_params *)local_120,
                   (pRVar7->raftServer).
                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        local_c8 = async_handler;
        nuraft::raft_server::update_params
                  ((pRVar7->raftServer).
                   super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                   (raft_params *)local_120);
        ppRVar13 = ppRVar13 + 1;
      } while (ppRVar13 != ppRVar3);
    }
    uVar14 = 0;
    do {
      cVar18 = '\x01';
      local_120._0_8_ = &aStack_110;
      if (9 < uVar14) {
        uVar10 = uVar14;
        cVar17 = '\x04';
        do {
          cVar18 = cVar17;
          if (uVar10 < 100) {
            cVar18 = cVar18 + -2;
            goto LAB_001a02a9;
          }
          if (uVar10 < 1000) {
            cVar18 = cVar18 + -1;
            goto LAB_001a02a9;
          }
          if (uVar10 < 10000) goto LAB_001a02a9;
          bVar1 = 99999 < uVar10;
          uVar10 = uVar10 / 10000;
          cVar17 = cVar18 + '\x04';
        } while (bVar1);
        cVar18 = cVar18 + '\x01';
      }
LAB_001a02a9:
      std::__cxx11::string::_M_construct((ulong)local_120,cVar18);
      std::__detail::__to_chars_10_impl<unsigned_long>
                ((char *)local_120._0_8_,local_120._8_4_,uVar14);
      nuraft::buffer::alloc((buffer *)&local_b8,local_120._8_8_ + 4);
      local_78 = uVar14;
      nuraft::buffer_serializer::buffer_serializer
                ((buffer_serializer *)local_98,(ptr<buffer> *)&local_b8,LITTLE);
      nuraft::buffer_serializer::put_str((buffer_serializer *)local_98,(string *)local_120);
      ppRVar3 = local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
      for (ppRVar13 = local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                      _M_impl.super__Vector_impl_data._M_start; uVar14 = local_78,
          ppRVar13 != ppRVar3; ppRVar13 = ppRVar13 + 1) {
        logs = ((*ppRVar13)->raftServer).
               super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr = local_b8;
        local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_b0;
        if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            local_b0->_M_use_count = local_b0->_M_use_count + 1;
            UNLOCK();
          }
          else {
            local_b0->_M_use_count = local_b0->_M_use_count + 1;
          }
        }
        __l._M_len = 1;
        __l._M_array = &local_a8;
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                *)(local_70 + 0x10),__l,&local_139);
        nuraft::raft_server::append_entries
                  ((raft_server *)local_70,
                   (vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                    *)logs);
        if ((element_type *)local_70._8_8_ != (element_type *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_70._8_8_);
        }
        std::
        vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>::
        ~vector((vector<std::shared_ptr<nuraft::buffer>,_std::allocator<std::shared_ptr<nuraft::buffer>_>_>
                 *)(local_70 + 0x10));
        if (local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_a8.super___shared_ptr<nuraft::buffer,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
      }
      if (local_b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_b0);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_120._0_8_ != &aStack_110) {
        operator_delete((void *)local_120._0_8_);
      }
      uVar14 = uVar14 + 1;
    } while (uVar14 != 500);
    local_120._0_8_ = &aStack_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"wait for replication","");
    psVar19 = (string *)local_120;
    TestSuite::sleep_sec(1,psVar19);
    uVar11 = extraout_RDX;
    ppRVar22 = local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
               super__Vector_impl_data._M_start;
    ppRVar2 = local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != &aStack_110) {
      operator_delete((void *)local_120._0_8_);
      uVar11 = extraout_RDX_00;
      ppRVar22 = local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl
                 .super__Vector_impl_data._M_start;
      ppRVar2 = local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
                super__Vector_impl_data._M_finish;
    }
    for (; ppRVar22 != ppRVar2; ppRVar22 = ppRVar22 + 1) {
      pRVar7 = *ppRVar22;
      nuraft::raft_server::shutdown
                ((pRVar7->raftServer).
                 super___shared_ptr<nuraft::raft_server,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                 (int)psVar19,(int)uVar11);
      uVar11 = extraout_RDX_01;
      if (pRVar7 != (RaftAsioPkg *)0x0) {
        RaftAsioPkg::~RaftAsioPkg(pRVar7);
        operator_delete(pRVar7);
        uVar11 = extraout_RDX_02;
      }
    }
    local_120._0_8_ = &aStack_110;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_120,"shutting down","");
    psVar19 = (string *)local_120;
    TestSuite::sleep_sec(1,psVar19);
    iVar5 = (int)psVar19;
    paVar20 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_120._0_8_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != &aStack_110) {
      operator_delete((void *)local_120._0_8_);
    }
    __fd = (int)paVar20;
    SimpleLogger::shutdown(__fd,iVar5);
    iVar12 = 0;
    nuraft::nuraft_global_mgr::shutdown(__fd,iVar5);
  }
  else {
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x38);
    std::ostream::put(-0x38);
    poVar8 = (ostream *)std::ostream::flush();
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"        time: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[1;30m",7);
    TestSuite::getTimeString_abi_cxx11_();
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar8,(char *)local_120._0_8_,local_120._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"      thread: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[33m",5);
    lVar15 = *(long *)poVar8;
    *(uint *)(poVar8 + *(long *)(lVar15 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(lVar15 + -0x18) + 0x18) & 0xffffffb5 | 8;
    *(undefined8 *)(poVar8 + *(long *)(lVar15 + -0x18) + 0x10) = 4;
    poVar21 = poVar8 + *(long *)(lVar15 + -0x18);
    if (poVar8[*(long *)(lVar15 + -0x18) + 0xe1] == (ostream)0x0) {
      oVar4 = (ostream)std::ios::widen((char)poVar21);
      poVar21[0xe0] = oVar4;
      poVar21[0xe1] = (ostream)0x1;
    }
    poVar21[0xe0] = (ostream)0x30;
    local_98._0_8_ = pthread_self();
    std::_Hash_bytes(local_98,8,0xc70f6907);
    poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
    *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) =
         *(uint *)(poVar8 + *(long *)(*(long *)poVar8 + -0x18) + 0x18) & 0xffffffb5 | 2;
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"          in: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[36m",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"global_mgr_heavy_test",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"()\x1b[0m",6);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"          at: ",0xe);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[32m",5);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,
               "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/tests/unit/asio_service_test.cxx"
               ,0x6b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m:",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[1;35m",7);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,0x4a4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m",4);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\n",1);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar8,"    value of: \x1b[1;34mlaunch_servers(pkgs, false, true)\x1b[0m\n",0x3b);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"    expected: \x1b[1;32m",0x15);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"0",1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m\n",5);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"      actual: \x1b[1;31m",0x15);
    poVar8 = (ostream *)std::ostream::operator<<(poVar8,-1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,"\x1b[0m\n",5);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._0_8_ != &aStack_110) {
      operator_delete((void *)local_120._0_8_);
    }
    iVar12 = -1;
    TestSuite::failHandler();
  }
  if (local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>._M_impl.
      super__Vector_impl_data._M_start != (RaftAsioPkg **)0x0) {
    operator_delete(local_138.super__Vector_base<RaftAsioPkg_*,_std::allocator<RaftAsioPkg_*>_>.
                    _M_impl.super__Vector_impl_data._M_start);
  }
  return iVar12;
}

Assistant:

int global_mgr_heavy_test() {
    reset_log_files();

    nuraft_global_config g_config;
    g_config.num_commit_threads_ = 2;
    g_config.num_append_threads_ = 2;
    nuraft_global_mgr::init(g_config);
    const size_t NUM_SERVERS = 50;

    std::vector<RaftAsioPkg*> pkgs;
    for (size_t ii = 0; ii < NUM_SERVERS; ++ii) {
        std::string addr = "127.0.0.1:" + std::to_string(20000 + (ii+1) * 10);
        RaftAsioPkg* pkg = new RaftAsioPkg(ii+1, addr);
        pkgs.push_back(pkg);
    }

    CHK_Z( launch_servers(pkgs, false, true) );
    TestSuite::sleep_sec(1, "wait for Raft group ready");

    // Set async.
    for (auto& entry: pkgs) {
        RaftAsioPkg* pp = entry;
        raft_params param = pp->raftServer->get_current_params();
        param.return_method_ = raft_params::async_handler;
        pp->raftServer->update_params(param);
    }

    for (size_t ii=0; ii<500; ++ii) {
        std::string msg_str = std::to_string(ii);
        ptr<buffer> msg = buffer::alloc(sizeof(uint32_t) + msg_str.size());
        buffer_serializer bs(msg);
        bs.put_str(msg_str);

        for (auto& entry: pkgs) {
            RaftAsioPkg* pkg = entry;
            pkg->raftServer->append_entries( {msg} );
        }
    }
    TestSuite::sleep_sec(1, "wait for replication");

    for (auto& entry: pkgs) {
        RaftAsioPkg* pkg = entry;
        pkg->raftServer->shutdown();
        delete pkg;
    }
    TestSuite::sleep_sec(1, "shutting down");

    SimpleLogger::shutdown();
    nuraft_global_mgr::shutdown();
    return 0;
}